

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump2XYZCmd.cpp
# Opt level: O3

int update_arg(void *field,char **orig_field,uint *field_given,uint *prev_given,char *value,
              char **possible_values,char *default_value,cmdline_parser_arg_type arg_type,
              int check_ambiguity,int override,int no_free,int multiple_option,char *long_opt,
              char short_opt,char *additional_error)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  undefined4 in_stack_00000024;
  char *local_38;
  
  local_38 = (char *)0x0;
  if (prev_given == (uint *)0x0) {
LAB_00124544:
    if (((field_given != (uint *)0x0) && (arg_type == ARG_NO)) && (*field_given != 0)) {
      return 0;
    }
    if (prev_given != (uint *)0x0) {
      *prev_given = *prev_given + 1;
    }
    if (field_given != (uint *)0x0) goto LAB_00124567;
  }
  else {
    if (*prev_given != 0) {
LAB_0012461b:
      if ((byte)no_free == 0x2d) {
        update_arg();
        return 1;
      }
      fprintf(_stderr,"%s: `--%s\' (`-%c\') option given more than once%s\n",package_name,
              CONCAT44(in_stack_00000024,override),(ulong)(byte)no_free,"");
      return 1;
    }
    if ((int)default_value == 0) goto LAB_00124544;
    if (*field_given != 0) goto LAB_0012461b;
    *prev_given = *prev_given + 1;
LAB_00124567:
    *field_given = *field_given + 1;
  }
  if ((int)possible_values == 1) {
    *(uint *)field = (uint)(*field == 0);
    return 0;
  }
  if ((int)possible_values == 2) {
    if (value != (char *)0x0) {
      if ((check_ambiguity == 0) && (*field != (void *)0x0)) {
        free(*field);
      }
      pcVar1 = gengetopt_strdup(value);
      *(char **)field = pcVar1;
    }
  }
  else if (value != (char *)0x0) {
    lVar2 = strtol(value,&local_38,0);
    *(int *)field = (int)lVar2;
    if ((local_38 == (char *)0x0) || (bVar3 = true, *local_38 != '\0')) {
      update_arg();
      return 1;
    }
    goto LAB_001245e9;
  }
  bVar3 = value != (char *)0x0;
LAB_001245e9:
  if (!(bool)(bVar3 ^ 1U | orig_field == (char **)0x0)) {
    if (check_ambiguity == 0) {
      if (*orig_field != (char *)0x0) {
        free(*orig_field);
      }
      pcVar1 = gengetopt_strdup(value);
      *orig_field = pcVar1;
    }
    else {
      *orig_field = value;
    }
  }
  return 0;
}

Assistant:

static
int update_arg(void *field, char **orig_field,
               unsigned int *field_given, unsigned int *prev_given, 
               char *value, const char *possible_values[],
               const char *default_value,
               cmdline_parser_arg_type arg_type,
               int check_ambiguity, int override,
               int no_free, int multiple_option,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  char *stop_char = 0;
  const char *val = value;
  int found;
  char **string_field;
  FIX_UNUSED (field);

  stop_char = 0;
  found = 0;

  if (!multiple_option && prev_given && (*prev_given || (check_ambiguity && *field_given)))
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: `--%s' (`-%c') option given more than once%s\n", 
               package_name, long_opt, short_opt,
               (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: `--%s' option given more than once%s\n", 
               package_name, long_opt,
               (additional_error ? additional_error : ""));
      return 1; /* failure */
    }

  FIX_UNUSED (default_value);
    
  if (field_given && *field_given && ! override)
    return 0;
  if (prev_given)
    (*prev_given)++;
  if (field_given)
    (*field_given)++;
  if (possible_values)
    val = possible_values[found];

  switch(arg_type) {
  case ARG_FLAG:
    *((int *)field) = !*((int *)field);
    break;
  case ARG_INT:
    if (val) *((int *)field) = strtol (val, &stop_char, 0);
    break;
  case ARG_STRING:
    if (val) {
      string_field = (char **)field;
      if (!no_free && *string_field)
        free (*string_field); /* free previous string */
      *string_field = gengetopt_strdup (val);
    }
    break;
  default:
    break;
  };

  /* check numeric conversion */
  switch(arg_type) {
  case ARG_INT:
    if (val && !(stop_char && *stop_char == '\0')) {
      fprintf(stderr, "%s: invalid numeric value: %s\n", package_name, val);
      return 1; /* failure */
    }
    break;
  default:
    ;
  };

  /* store the original value */
  switch(arg_type) {
  case ARG_NO:
  case ARG_FLAG:
    break;
  default:
    if (value && orig_field) {
      if (no_free) {
        *orig_field = value;
      } else {
        if (*orig_field)
          free (*orig_field); /* free previous string */
        *orig_field = gengetopt_strdup (value);
      }
    }
  };

  return 0; /* OK */
}